

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sophia_interface.cpp
# Opt level: O0

double __thiscall sophia_interface::Ef(sophia_interface *this,double x,double th,double w)

{
  runtime_error *this_00;
  double wth;
  double w_local;
  double th_local;
  double x_local;
  sophia_interface *this_local;
  
  if (th < x) {
    if ((x <= th) || (w + th <= x)) {
      if (x < w + th) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_00,"error in function Ef");
        __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      this_local = (sophia_interface *)0x3ff0000000000000;
    }
    else {
      this_local = (sophia_interface *)((x - th) / w);
    }
  }
  else {
    this_local = (sophia_interface *)0x0;
  }
  return (double)this_local;
}

Assistant:

double sophia_interface::Ef(double x, double th, double w) {
    double wth = w + th;
    if (x <= th) {
        return 0.;
    } else if (x > th && x < wth) {
        return (x - th) / w;
    } else if (x >= wth) {
        return 1.;
    } else {
        throw std::runtime_error("error in function Ef");
    }
}